

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O2

Rectangle GetImageAlphaBorder(Image image,float threshold)

{
  Color *__ptr;
  int iVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  uchar *puVar9;
  int x;
  ulong uVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  Rectangle RVar15;
  
  __ptr = LoadImageColors(image);
  if (__ptr == (Color *)0x0) {
    fVar11 = 0.0;
    fVar12 = 0.0;
    fVar13 = 0.0;
    fVar14 = 0.0;
  }
  else {
    uVar6 = 0;
    uVar7 = 0;
    if (0 < image.width) {
      uVar7 = (ulong)(uint)image.width;
    }
    uVar3 = (ulong)(uint)image.height;
    if (image.height < 1) {
      uVar3 = uVar6;
    }
    puVar9 = &__ptr->a;
    iVar1 = 0x10000;
    iVar2 = 0;
    iVar4 = 0;
    iVar8 = 0x10000;
    for (; uVar6 != uVar3; uVar6 = uVar6 + 1) {
      for (uVar10 = 0; uVar7 != uVar10; uVar10 = uVar10 + 1) {
        if ((byte)(int)(threshold * 255.0) < puVar9[uVar10 * 4]) {
          iVar5 = (int)uVar10;
          if (iVar5 < iVar8) {
            iVar8 = iVar5;
          }
          if (iVar4 < iVar5) {
            iVar4 = iVar5;
          }
          iVar5 = (int)uVar6;
          if (iVar5 < iVar1) {
            iVar1 = iVar5;
          }
          if (iVar2 < iVar5) {
            iVar2 = iVar5;
          }
        }
      }
      puVar9 = puVar9 + (long)image.width * 4;
    }
    fVar11 = 0.0;
    fVar12 = 0.0;
    fVar13 = 0.0;
    fVar14 = 0.0;
    if ((iVar8 != 0x10000) && (iVar4 != 0x10000)) {
      fVar11 = (float)iVar8;
      fVar12 = (float)iVar1;
      fVar13 = (float)((iVar4 - iVar8) + 1);
      fVar14 = (float)((iVar2 - iVar1) + 1);
    }
    free(__ptr);
  }
  RVar15.y = fVar12;
  RVar15.x = fVar11;
  RVar15.height = fVar14;
  RVar15.width = fVar13;
  return RVar15;
}

Assistant:

Rectangle GetImageAlphaBorder(Image image, float threshold)
{
    Rectangle crop = { 0 };

    Color *pixels = LoadImageColors(image);

    if (pixels != NULL)
    {
        int xMin = 65536;   // Define a big enough number
        int xMax = 0;
        int yMin = 65536;
        int yMax = 0;

        for (int y = 0; y < image.height; y++)
        {
            for (int x = 0; x < image.width; x++)
            {
                if (pixels[y*image.width + x].a > (unsigned char)(threshold*255.0f))
                {
                    if (x < xMin) xMin = x;
                    if (x > xMax) xMax = x;
                    if (y < yMin) yMin = y;
                    if (y > yMax) yMax = y;
                }
            }
        }

        // Check for empty blank image
        if ((xMin != 65536) && (xMax != 65536))
        {
            crop = (Rectangle){ (float)xMin, (float)yMin, (float)((xMax + 1) - xMin), (float)((yMax + 1) - yMin) };
        }

        UnloadImageColors(pixels);
    }

    return crop;
}